

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O0

XProtoType * __thiscall
xercesc_4_0::DatatypeValidatorFactory::getProtoType(DatatypeValidatorFactory *this)

{
  DatatypeValidatorFactory *this_local;
  
  return (XProtoType *)classDatatypeValidatorFactory;
}

Assistant:

void DatatypeValidatorFactory::serialize(XSerializeEngine& serEng)
{

    // Need not to serialize static data member, fBuiltInRegistry

    if (serEng.isStoring())
    {
        /***
         * Serialize RefHashTableOf<DatatypeValidator>
         ***/
        XTemplateSerializer::storeObject(fUserDefinedRegistry, serEng);
    }
    else
    {
        /***
         * Deserialize RefHashTableOf<DatatypeValidator>
         ***/
        XTemplateSerializer::loadObject(&fUserDefinedRegistry, 29, true, serEng);
    }

}